

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O3

void __thiscall Downloader::startDownload(Downloader *this,QUrl *url)

{
  QPushButton *pQVar1;
  QLabel *pQVar2;
  char cVar3;
  uint uVar4;
  QNetworkReply *pQVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QString t_1;
  QNetworkRequest request;
  QByteArray local_a8;
  QArrayData *local_88;
  char16_t *pcStack_80;
  qsizetype qStack_78;
  QByteArray local_68;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QArrayData *local_38;
  char *local_30;
  qsizetype qStack_28;
  
  QProgressBar::setValue((int)(this->m_ui->super_Ui_Downloader).progressBar);
  pQVar1 = (this->m_ui->super_Ui_Downloader).stopButton;
  QMetaObject::tr((char *)&local_a8,(char *)&staticMetaObject,0x119b75);
  QAbstractButton::setText((QString *)pQVar1);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar2 = (this->m_ui->super_Ui_Downloader).downloadLabel;
  QMetaObject::tr((char *)&local_a8,(char *)&staticMetaObject,0x119b7a);
  QLabel::setText((QString *)pQVar2);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar2 = (this->m_ui->super_Ui_Downloader).timeLabel;
  QMetaObject::tr((char *)&local_38,(char *)&staticMetaObject,0x119b8e);
  local_68.d.d = (Data *)local_38;
  local_68.d.ptr = local_30;
  local_68.d.size = qStack_28;
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar6.m_data = (storage_type *)0x2;
  QVar6.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar6);
  QString::append((QString *)&local_68);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
  QMetaObject::tr((char *)&local_a8,(char *)&staticMetaObject,0x119ba0);
  local_88 = &(local_68.d.d)->super_QArrayData;
  pcStack_80 = (char16_t *)local_68.d.ptr;
  qStack_78 = local_68.d.size;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QString *)&local_88);
  QLabel::setText((QString *)pQVar2);
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  QNetworkRequest::QNetworkRequest((QNetworkRequest *)&local_68,url);
  QVariant::QVariant((QVariant *)&local_a8,1);
  QNetworkRequest::setAttribute((Attribute)&local_68,(QVariant *)0x16);
  QVariant::~QVariant((QVariant *)&local_a8);
  QNetworkRequest::setTransferTimeout((int)&local_68);
  if ((this->m_userAgentString).d.size != 0) {
    QByteArray::QByteArray(&local_a8,"User-Agent",-1);
    QString::toUtf8_helper((QString *)&local_88);
    QNetworkRequest::setRawHeader(&local_68,&local_a8);
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,1,8);
      }
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,8);
      }
    }
  }
  pQVar5 = (QNetworkReply *)QNetworkAccessManager::get((QNetworkRequest *)this->m_manager);
  this->m_reply = pQVar5;
  QDateTime::currentDateTime();
  uVar4 = QDateTime::toSecsSinceEpoch();
  this->m_startTime = uVar4;
  QDateTime::~QDateTime((QDateTime *)&local_a8);
  cVar3 = QDir::exists();
  if (cVar3 == '\0') {
    QVar7.m_data = (storage_type *)0x1;
    QVar7.m_size = (qsizetype)&local_a8;
    QString::fromUtf8(QVar7);
    local_88 = &(local_a8.d.d)->super_QArrayData;
    pcStack_80 = (char16_t *)local_a8.d.ptr;
    qStack_78 = local_a8.d.size;
    QDir::mkpath((QString *)&this->m_downloadDir);
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,8);
      }
    }
  }
  QDir::filePath((QString *)&local_a8);
  QFile::remove((QString *)&local_a8);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
  local_88 = &((this->m_fileName).d.d)->super_QArrayData;
  pcStack_80 = (this->m_fileName).d.ptr;
  qStack_78 = (this->m_fileName).d.size;
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QString *)&local_88);
  QDir::filePath((QString *)&local_a8);
  QFile::remove((QString *)&local_a8);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  QObject::connect(local_40,(char *)this->m_reply,(QObject *)"2metaDataChanged()",(char *)this,
                   0x119bbb);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect(local_48,(char *)this->m_reply,(QObject *)"2downloadProgress(qint64, qint64)",
                   (char *)this,0x119bf0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QObject::connect(local_50,(char *)this->m_reply,(QObject *)"2finished()",(char *)this,0x119c1c);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QWidget::showNormal();
  QNetworkRequest::~QNetworkRequest((QNetworkRequest *)&local_68);
  return;
}

Assistant:

void Downloader::startDownload(const QUrl &url)
{
   /* Reset UI */
   m_ui->progressBar->setValue(0);
   m_ui->stopButton->setText(tr("Stop"));
   m_ui->downloadLabel->setText(tr("Downloading updates"));
   m_ui->timeLabel->setText(tr("Time remaining") + ": " + tr("unknown"));

   /* Configure the network request */
   QNetworkRequest request(url);

   request.setAttribute(QNetworkRequest::RedirectPolicyAttribute, QNetworkRequest::NoLessSafeRedirectPolicy);
   
#if (QT_VERSION >= QT_VERSION_CHECK(5, 15, 0))
   /* 10s timeout */
   request.setTransferTimeout(10000);
#endif

   if (!m_userAgentString.isEmpty())
      request.setRawHeader("User-Agent", m_userAgentString.toUtf8());

   /* Start download */
   m_reply = m_manager->get(request);
   m_startTime = QDateTime::currentDateTime().toSecsSinceEpoch();

   /* Ensure that downloads directory exists */
   if (!m_downloadDir.exists())
      m_downloadDir.mkpath(".");

   /* Remove old downloads */
   QFile::remove(m_downloadDir.filePath(m_fileName));
   QFile::remove(m_downloadDir.filePath(m_fileName + PARTIAL_DOWN));

   /* Update UI when download progress changes or download finishes */
   connect(m_reply, SIGNAL(metaDataChanged()), this, SLOT(metaDataChanged()));
   connect(m_reply, SIGNAL(downloadProgress(qint64, qint64)), this, SLOT(updateProgress(qint64, qint64)));
   connect(m_reply, SIGNAL(finished()), this, SLOT(finished()));

   showNormal();
}